

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,Privkey *privkey,bool use_wif_parameter,NetType net_type,
          bool is_compressed,string *parent_key_information)

{
  ulong uVar1;
  string local_80;
  string local_60;
  string *local_30;
  string *parent_key_information_local;
  NetType local_20;
  bool is_compressed_local;
  NetType net_type_local;
  bool use_wif_parameter_local;
  Privkey *privkey_local;
  DescriptorKeyInfo *this_local;
  
  this->key_type_ = kDescriptorKeyPublic;
  local_30 = parent_key_information;
  parent_key_information_local._7_1_ = is_compressed;
  local_20 = net_type;
  is_compressed_local = use_wif_parameter;
  _net_type_local = privkey;
  privkey_local = (Privkey *)this;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_,_net_type_local);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::__cxx11::string::string((string *)&this->parent_info_);
  ::std::__cxx11::string::string((string *)&this->path_);
  ::std::__cxx11::string::string((string *)&this->key_string_);
  if ((is_compressed_local & 1U) == 0) {
    Privkey::GetWif_abi_cxx11_(&local_80,_net_type_local);
    ::std::__cxx11::string::operator=((string *)&this->key_string_,(string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    Privkey::ConvertWif_abi_cxx11_
              (&local_60,_net_type_local,local_20,(bool)(parent_key_information_local._7_1_ & 1));
    ::std::__cxx11::string::operator=((string *)&this->key_string_,(string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::operator=
              ((string *)&this->parent_info_,(string *)parent_key_information);
  }
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const Privkey& privkey, bool use_wif_parameter, NetType net_type,
    bool is_compressed, const std::string parent_key_information)
    : key_type_(DescriptorKeyType::kDescriptorKeyPublic), privkey_(privkey) {
  if (use_wif_parameter) {
    key_string_ = privkey.ConvertWif(net_type, is_compressed);
  } else {
    key_string_ = privkey.GetWif();
  }
  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
}